

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O0

void mpack_write_bin(mpack_writer_t *writer,char *data,uint32_t count)

{
  uint32_t count_local;
  char *data_local;
  mpack_writer_t *writer_local;
  
  mpack_start_bin(writer,count);
  mpack_write_bytes(writer,data,(ulong)count);
  mpack_finish_bin(writer);
  return;
}

Assistant:

void mpack_write_bin(mpack_writer_t* writer, const char* data, uint32_t count) {
    mpack_assert(data != NULL, "data pointer for bin of %i bytes is NULL", (int)count);
    mpack_start_bin(writer, count);
    mpack_write_bytes(writer, data, count);
    mpack_finish_bin(writer);
}